

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

long cmsys::SystemTools::CreationTime(string *filename)

{
  int iVar1;
  char *__file;
  __syscall_slong_t local_b0;
  undefined1 local_a8 [8];
  stat fs;
  long ct;
  string *filename_local;
  
  fs.__glibc_reserved[2] = 0;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(__file,(stat64 *)local_a8);
  if (iVar1 == 0) {
    if (fs.st_mtim.tv_nsec < 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = fs.st_mtim.tv_nsec;
    }
    fs.__glibc_reserved[2] = local_b0;
  }
  return fs.__glibc_reserved[2];
}

Assistant:

long int SystemTools::CreationTime(const std::string& filename)
{
  long int ct = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                           GetFileExInfoStandard, &fs) != 0) {
    ct = windows_filetime_to_posix_time(fs.ftCreationTime);
  }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0) {
    ct = fs.st_ctime >= 0 ? static_cast<long int>(fs.st_ctime) : 0;
  }
#endif
  return ct;
}